

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::TupleDataAllocator::Build
          (TupleDataAllocator *this,TupleDataSegment *segment,TupleDataPinState *pin_state,
          TupleDataChunkState *chunk_state,idx_t append_offset,idx_t append_count)

{
  TupleDataLayout *pTVar1;
  value_type vVar2;
  pointer prVar3;
  pointer ppVar4;
  data_ptr_t pdVar5;
  pointer pTVar6;
  TupleDataChunkPart *part;
  const_reference pvVar7;
  const_reference pvVar8;
  pointer pTVar9;
  idx_t iVar10;
  unsigned_long *aggr_idx;
  ulong uVar11;
  size_type *psVar12;
  long lVar13;
  pointer ppVar14;
  ulong uVar15;
  TupleDataChunk *chunk;
  uint local_b4;
  TupleDataChunkState *local_b0;
  idx_t local_a8;
  TupleDataSegment *local_a0;
  unsafe_vector<TupleDataChunk> *local_98;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_90;
  idx_t local_88;
  long local_80;
  pointer local_78;
  long local_70;
  data_ptr_t local_68;
  size_type *local_60;
  TupleDataChunkPart local_58;
  
  pTVar6 = (segment->chunks).
           super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
           super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_b0 = chunk_state;
  local_a8 = append_offset;
  local_88 = append_count;
  if ((segment->chunks).
      super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
      super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>._M_impl.
      super__Vector_impl_data._M_start != pTVar6) {
    ReleaseOrStoreHandles(this,pin_state,segment,pTVar6 + -1,true);
  }
  ppVar14 = (this->chunk_part_indices).
            super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            .
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->chunk_part_indices).
      super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar14) {
    (this->chunk_part_indices).
    super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar14;
  }
  local_98 = &segment->chunks;
  local_90 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&this->chunk_part_indices;
  lVar13 = 0;
  local_a0 = segment;
  while (uVar11 = local_88 - lVar13, uVar11 != 0) {
    pTVar6 = (segment->chunks).
             super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
             super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar9 = (segment->chunks).
             super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
             super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((pTVar6 == pTVar9) || (pTVar9[-1].count == 0x800)) {
      ::std::vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>::emplace_back<>
                (&local_98->
                  super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>);
      pTVar6 = (segment->chunks).
               super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
               super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar9 = (segment->chunks).
               super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
               super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    local_80 = (long)pTVar9 - (long)pTVar6;
    chunk = (TupleDataChunk *)((long)pTVar6 + local_80 + -0x28);
    uVar15 = 0x800 - *(long *)((long)pTVar6 + local_80 + -0x10);
    if (uVar11 < uVar15) {
      uVar15 = uVar11;
    }
    local_78 = pTVar6;
    local_70 = lVar13;
    BuildChunkPart(&local_58,this,pin_state,local_b0,lVar13 + local_a8,uVar15,chunk);
    part = TupleDataChunk::AddPart(chunk,segment,&local_58);
    uVar11 = (ulong)part->count;
    segment->count = segment->count + uVar11;
    pTVar1 = this->layout;
    iVar10 = pTVar1->row_width * uVar11 + segment->data_size;
    segment->data_size = iVar10;
    if (pTVar1->all_constant == false) {
      local_a0->data_size = iVar10 + part->total_heap_size;
    }
    if ((pTVar1->aggr_destructor_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pTVar1->aggr_destructor_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_68 = GetRowPointer(this,pin_state,part);
      local_60 = (this->layout->aggr_destructor_idxs).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      for (psVar12 = (this->layout->aggr_destructor_idxs).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; psVar12 != local_60; psVar12 = psVar12 + 1) {
        pTVar1 = this->layout;
        pvVar7 = vector<unsigned_long,_true>::get<true>
                           (&pTVar1->offsets,
                            ((long)(pTVar1->types).
                                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   .
                                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar1->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18 + *psVar12);
        pdVar5 = local_68;
        vVar2 = *pvVar7;
        pvVar8 = vector<duckdb::AggregateObject,_true>::get<true>
                           (&this->layout->aggregates,*psVar12);
        for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
          FastMemset(pdVar5 + this->layout->row_width * uVar15 + vVar2,0,pvVar8->payload_size);
        }
      }
    }
    segment = local_a0;
    lVar13 = local_70 + uVar11;
    local_58._0_8_ =
         ((long)(local_a0->chunks).
                super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)(local_a0->chunks).
               super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
               super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
               _M_impl.super__Vector_impl_data._M_start) / 0x28 + -1;
    local_b4 = *(uint *)((long)local_78 + local_80 + -0x24);
    ::std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long,unsigned_int>(local_90,(unsigned_long *)&local_58,&local_b4);
  }
  prVar3 = (this->chunk_parts).
           super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->chunk_parts).
      super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != prVar3) {
    (this->chunk_parts).
    super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = prVar3;
  }
  ppVar4 = (this->chunk_part_indices).
           super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           .
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar14 = (this->chunk_part_indices).
                 super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar4; ppVar14 = ppVar14 + 1
      ) {
    ::std::
    vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>>>
    ::emplace_back<duckdb::TupleDataChunkPart&>
              ((vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>>>
                *)&this->chunk_parts,
               (segment->chunk_parts).
               super_vector<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
               .
               super__Vector_base<duckdb::TupleDataChunkPart,_std::allocator<duckdb::TupleDataChunkPart>_>
               ._M_impl.super__Vector_impl_data._M_start + ppVar14->second);
  }
  InitializeChunkStateInternal(this,pin_state,local_b0,local_a8,false,true,false,&this->chunk_parts)
  ;
  TupleDataChunk::MergeLastChunkPart
            ((segment->chunks).
             super_vector<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
             super__Vector_base<duckdb::TupleDataChunk,_std::allocator<duckdb::TupleDataChunk>_>.
             _M_impl.super__Vector_impl_data._M_start +
             ((this->chunk_part_indices).
              super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              .
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->first,segment);
  return;
}

Assistant:

void TupleDataAllocator::Build(TupleDataSegment &segment, TupleDataPinState &pin_state,
                               TupleDataChunkState &chunk_state, const idx_t append_offset, const idx_t append_count) {
	D_ASSERT(this == segment.allocator.get());
	auto &chunks = segment.chunks;
	if (!chunks.empty()) {
		ReleaseOrStoreHandles(pin_state, segment, chunks.back(), true);
	}

	// Build the chunk parts for the incoming data
	chunk_part_indices.clear();
	idx_t offset = 0;
	while (offset != append_count) {
		if (chunks.empty() || chunks.back().count == STANDARD_VECTOR_SIZE) {
			chunks.emplace_back();
		}
		auto &chunk = chunks.back();

		// Build the next part
		auto next = MinValue<idx_t>(append_count - offset, STANDARD_VECTOR_SIZE - chunk.count);
		auto &chunk_part =
		    chunk.AddPart(segment, BuildChunkPart(pin_state, chunk_state, append_offset + offset, next, chunk));
		next = chunk_part.count;

		segment.count += next;
		segment.data_size += chunk_part.count * layout.GetRowWidth();
		if (!layout.AllConstant()) {
			segment.data_size += chunk_part.total_heap_size;
		}

		if (layout.HasDestructor()) {
			const auto base_row_ptr = GetRowPointer(pin_state, chunk_part);
			for (auto &aggr_idx : layout.GetAggregateDestructorIndices()) {
				const auto aggr_offset = layout.GetOffsets()[layout.ColumnCount() + aggr_idx];
				auto &aggr_fun = layout.GetAggregates()[aggr_idx];
				for (idx_t i = 0; i < next; i++) {
					duckdb::FastMemset(base_row_ptr + i * layout.GetRowWidth() + aggr_offset, '\0',
					                   aggr_fun.payload_size);
				}
			}
		}

		offset += next;
		chunk_part_indices.emplace_back(chunks.size() - 1, chunk.part_ids.End() - 1);
	}

	// Now initialize the pointers to write the data to
	chunk_parts.clear();
	for (const auto &indices : chunk_part_indices) {
		chunk_parts.emplace_back(segment.chunk_parts[indices.second]);
	}
	InitializeChunkStateInternal(pin_state, chunk_state, append_offset, false, true, false, chunk_parts);

	// To reduce metadata, we try to merge chunk parts where possible
	// Due to the way chunk parts are constructed, only the last part of the first chunk is eligible for merging
	segment.chunks[chunk_part_indices[0].first].MergeLastChunkPart(segment);

	segment.Verify();
}